

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

WFile * open_new_file(char *name,long perms)

{
  int iVar1;
  char *pcVar2;
  ulong local_40;
  WFile *ret;
  int fd;
  long perms_local;
  char *name_local;
  
  local_40 = perms;
  if (perms == 0) {
    local_40 = 0x1b6;
  }
  iVar1 = open(name,0x241,local_40 & 0xffffffff);
  if (iVar1 < 0) {
    name_local = (char *)0x0;
  }
  else {
    name_local = (char *)safemalloc(1,0x10,0);
    *(int *)name_local = iVar1;
    pcVar2 = dupstr(name);
    *(char **)((long)name_local + 8) = pcVar2;
  }
  return (WFile *)name_local;
}

Assistant:

WFile *open_new_file(const char *name, long perms)
{
    int fd;
    WFile *ret;

    fd = open(name, O_CREAT | O_TRUNC | O_WRONLY,
              (mode_t)(perms ? perms : 0666));
    if (fd < 0)
        return NULL;

    ret = snew(WFile);
    ret->fd = fd;
    ret->name = dupstr(name);

    return ret;
}